

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeom_utility.h
# Opt level: O3

bool IsInSideParametricDomain<pzgeom::TPZGeoTriangle>(int side,TPZVec<double> *pt,REAL tol)

{
  bool bVar1;
  MElementType MVar2;
  ostream *poVar3;
  stringstream sout;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  MVar2 = pztopology::TPZTriangle::Type(side);
  switch(MVar2) {
  case EPoint:
    return true;
  case EOned:
    bVar1 = pztopology::TPZLine::IsInParametricDomain(pt,tol);
    return bVar1;
  case ETriangle:
    bVar1 = pztopology::TPZTriangle::IsInParametricDomain(pt,tol);
    return bVar1;
  case EQuadrilateral:
    bVar1 = pztopology::TPZQuadrilateral::IsInParametricDomain(pt,tol);
    return bVar1;
  case ETetraedro:
    bVar1 = pztopology::TPZTetrahedron::IsInParametricDomain(pt,tol);
    return bVar1;
  case EPiramide:
    bVar1 = pztopology::TPZPyramid::IsInParametricDomain(pt,tol);
    return bVar1;
  case EPrisma:
    bVar1 = pztopology::TPZPrism::IsInParametricDomain(pt,tol);
    return bVar1;
  case ECube:
    bVar1 = pztopology::TPZCube::IsInParametricDomain(pt,tol);
    return bVar1;
  }
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"Fatal error at ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,
             "bool IsInSideParametricDomain(int, const TPZVec<REAL> &, REAL) [Topology = pzgeom::TPZGeoTriangle]"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>(local_188," - Element type ",0x10);
  poVar3 = (ostream *)std::ostream::operator<<(local_188,MVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," not found",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  std::__cxx11::stringbuf::str();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_1b8,local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/pzgeom_utility.h"
             ,0x12e);
}

Assistant:

inline bool IsInSideParametricDomain(int side, const TPZVec<REAL> &pt, REAL tol){
    MElementType type = Topology::Type(side);
    switch(type){
        case EPoint:
            return pztopology::TPZPoint::IsInParametricDomain(pt,tol);
        case EOned:
            return pztopology::TPZLine::IsInParametricDomain(pt,tol);
        case ETriangle:
            return pztopology::TPZTriangle::IsInParametricDomain(pt,tol);
        case EQuadrilateral:
            return pztopology::TPZQuadrilateral::IsInParametricDomain(pt,tol);
            
        case ETetraedro:
            return pztopology::TPZTetrahedron::IsInParametricDomain(pt,tol);
            
        case EPiramide:
            return pztopology::TPZPyramid::IsInParametricDomain(pt,tol);
            
        case EPrisma:
            return pztopology::TPZPrism::IsInParametricDomain(pt,tol);
            
        case ECube:
            return pztopology::TPZCube::IsInParametricDomain(pt,tol);
            
        default:
            std::stringstream sout;
            sout << "Fatal error at " << __PRETTY_FUNCTION__ << " - Element type " << type << " not found";
            PZError << "\n" << sout.str() << "\n";
            DebugStop();
            return false;
            break;
    }//case
    
    return false;
}